

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retinaface.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  pointer pFVar1;
  Allocator **ppAVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar8;
  ulong uVar6;
  undefined4 uVar9;
  ulong uVar7;
  undefined4 uVar10;
  char *pcVar11;
  int iVar12;
  int *piVar13;
  bool bVar14;
  Allocator *pAVar15;
  char cVar16;
  int iVar17;
  int iVar18;
  float *pfVar19;
  size_t sVar20;
  Mat *pMVar21;
  uint uVar22;
  ulong uVar23;
  pointer pFVar24;
  long lVar25;
  long lVar26;
  uint uVar27;
  undefined8 uVar28;
  __m128 t_2;
  __m128 t;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar32;
  float fVar38;
  undefined1 auVar34 [16];
  float fVar33;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar39 [16];
  Extractor ex;
  vector<float,_std::allocator<float>_> areas;
  vector<FaceObject,_std::allocator<FaceObject>_> faceobjects32;
  int baseLine;
  vector<FaceObject,_std::allocator<FaceObject>_> faceproposals;
  Size label_size;
  vector<FaceObject,_std::allocator<FaceObject>_> faceobjects;
  Mat image;
  Net retinaface;
  Mat m;
  undefined1 local_478 [16];
  undefined1 local_468 [64];
  size_t local_428;
  vector<FaceObject,_std::allocator<FaceObject>_> local_418;
  int local_3fc;
  undefined1 local_3f8 [64];
  size_t local_3b8;
  undefined1 local_3a8 [64];
  size_t local_368;
  vector<FaceObject,_std::allocator<FaceObject>_> local_358;
  undefined8 local_338;
  undefined1 auStack_330 [16];
  int local_320;
  int local_31c;
  undefined1 local_318 [32];
  Allocator *local_2f8;
  int iStack_2f0;
  int iStack_2ec;
  undefined1 auStack_2e8 [12];
  size_t local_2d8;
  undefined1 local_2c8 [16];
  pointer local_2b8;
  undefined1 local_2a8 [32];
  Allocator *local_288;
  int iStack_280;
  int iStack_27c;
  undefined1 auStack_278 [12];
  size_t local_268;
  Mat local_258;
  int local_210;
  int local_20c;
  int local_208;
  int local_204;
  ulong local_200;
  Mat local_1f8;
  Net local_198 [3];
  string local_90 [8];
  Allocator **local_88;
  uchar *local_80;
  
  if (argc == 2) {
    pcVar11 = argv[1];
    std::__cxx11::string::string((string *)local_198,pcVar11,(allocator *)&local_1f8);
    cv::imread(local_90,(int)local_198);
    if ((Allocator **)local_198[0]._vptr_Net != &local_198[0].opt.blob_allocator) {
      operator_delete(local_198[0]._vptr_Net);
    }
    cVar16 = cv::Mat::empty();
    if (cVar16 == '\0') {
      local_2c8 = (undefined1  [16])0x0;
      local_2b8 = (pointer)0x0;
      ncnn::Net::Net(local_198);
      local_198[0].opt.use_vulkan_compute = true;
      iVar17 = ncnn::Net::load_param(local_198,"mnet.25-opt.param");
      if ((iVar17 != 0) ||
         (iVar17 = ncnn::Net::load_model(local_198,"mnet.25-opt.bin"), iVar17 != 0)) {
        exit(-1);
      }
      local_338 = local_88;
      auStack_330[0] = false;
      auStack_330[1] = false;
      auStack_330[2] = false;
      auStack_330[3] = false;
      auStack_330._4_4_ = 0;
      ncnn::Mat::from_pixels
                (&local_1f8,local_80,0x10002,(int)((ulong)local_88 >> 0x20),(int)local_88,
                 (Allocator *)0x0);
      ncnn::Net::create_extractor((Net *)local_478);
      ncnn::Extractor::input((Extractor *)local_478,"data",&local_1f8);
      local_358.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_358.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_358.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_428 = 0;
      local_468._0_4_ = 0;
      local_468._4_4_ = 0;
      local_468._8_4_ = 0;
      local_468._12_4_ = 0;
      local_468._16_4_ = 0;
      local_468._20_4_ = 0;
      local_468._24_4_ = 0;
      local_468._32_8_ = (Allocator *)0x0;
      local_468._40_4_ = 0;
      local_468._44_4_ = 0;
      local_468._48_12_ = SUB1612((undefined1  [16])0x0,4);
      local_3b8 = 0;
      local_3f8._0_8_ = (void *)0x0;
      local_3f8._8_4_ = 0;
      local_3f8._12_4_ = 0;
      local_3f8._16_8_ = 0;
      local_3f8._24_4_ = 0;
      local_3f8._32_8_ = (Allocator *)0x0;
      local_3f8._40_4_ = 0;
      local_3f8._44_4_ = 0;
      local_3f8._48_12_ = SUB1612((undefined1  [16])0x0,4);
      local_368 = 0;
      local_3a8._0_4_ = 0;
      local_3a8._4_4_ = 0;
      local_3a8._8_4_ = 0;
      local_3a8._12_4_ = 0;
      local_3a8._16_8_ = 0;
      local_3a8._24_4_ = 0;
      local_3a8._32_8_ = (Allocator *)0x0;
      local_3a8._40_4_ = 0;
      local_3a8._44_4_ = 0;
      local_3a8._48_12_ = SUB1612((undefined1  [16])0x0,4);
      ncnn::Extractor::extract
                ((Extractor *)local_478,"face_rpn_cls_prob_reshape_stride32",(Mat *)local_468,0);
      ncnn::Extractor::extract
                ((Extractor *)local_478,"face_rpn_bbox_pred_stride32",(Mat *)local_3f8,0);
      ncnn::Extractor::extract
                ((Extractor *)local_478,"face_rpn_landmark_pred_stride32",(Mat *)local_3a8,0);
      local_2d8 = 0;
      local_318._0_4_ = 0;
      local_318._4_4_ = 0;
      local_318._8_4_ = 0;
      local_318._12_4_ = 0;
      local_318._16_12_ = SUB1612((undefined1  [16])0x0,4);
      local_2f8 = (Allocator *)0x0;
      iStack_2f0 = 0;
      iStack_2ec = 0;
      auStack_2e8 = SUB1612((undefined1  [16])0x0,4);
      ncnn::Mat::create((Mat *)local_318,1,4,(Allocator *)0x0);
      *(undefined4 *)CONCAT44(local_318._4_4_,local_318._0_4_) = 0x3f800000;
      local_268 = 0;
      local_2a8._0_4_ = 0;
      local_2a8._4_4_ = 0;
      local_2a8._8_4_ = 0;
      local_2a8._12_4_ = 0;
      local_2a8._16_12_ = SUB1612((undefined1  [16])0x0,4);
      local_288 = (Allocator *)0x0;
      iStack_280 = 0;
      iStack_27c = 0;
      auStack_278 = SUB1612((undefined1  [16])0x0,4);
      pMVar21 = (Mat *)0x0;
      ncnn::Mat::create((Mat *)local_2a8,2,4,(Allocator *)0x0);
      *(undefined8 *)CONCAT44(local_2a8._4_4_,local_2a8._0_4_) = 0x4180000042000000;
      generate_anchors(&local_258,(int)local_318,(Mat *)local_2a8,pMVar21);
      local_418.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_418.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_418.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      generate_proposals(&local_258,0x20,(Mat *)local_468,(Mat *)local_3f8,(Mat *)local_3a8,0.0,
                         &local_418);
      std::vector<FaceObject,std::allocator<FaceObject>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<FaceObject*,std::vector<FaceObject,std::allocator<FaceObject>>>>
                ((vector<FaceObject,std::allocator<FaceObject>> *)&local_358,
                 local_358.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 local_418.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                 super__Vector_impl_data._M_start);
      if (local_418.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_418.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_258.refcount != (int *)0x0) {
        LOCK();
        *local_258.refcount = *local_258.refcount + -1;
        UNLOCK();
        if (*local_258.refcount == 0) {
          if (local_258.allocator == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_258.data._4_4_,(int)local_258.data) != (void *)0x0) {
              free((void *)CONCAT44(local_258.data._4_4_,(int)local_258.data));
            }
          }
          else {
            (*(local_258.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar13 = (int *)CONCAT44(local_2a8._12_4_,local_2a8._8_4_);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if (local_288 == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_2a8._4_4_,local_2a8._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(local_2a8._4_4_,local_2a8._0_4_));
            }
          }
          else {
            (*local_288->_vptr_Allocator[3])();
          }
        }
      }
      piVar13 = (int *)CONCAT44(local_318._12_4_,local_318._8_4_);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if (local_2f8 == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_318._4_4_,local_318._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(local_318._4_4_,local_318._0_4_));
            }
          }
          else {
            (*local_2f8->_vptr_Allocator[3])();
          }
        }
      }
      piVar13 = (int *)CONCAT44(local_3a8._12_4_,local_3a8._8_4_);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if ((Allocator *)local_3a8._32_8_ == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_3a8._4_4_,local_3a8._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(local_3a8._4_4_,local_3a8._0_4_));
            }
          }
          else {
            (*(*(_func_int ***)local_3a8._32_8_)[3])();
          }
        }
      }
      piVar13 = (int *)CONCAT44(local_3f8._12_4_,local_3f8._8_4_);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if ((Allocator *)local_3f8._32_8_ == (Allocator *)0x0) {
            if ((void *)local_3f8._0_8_ != (void *)0x0) {
              free((void *)local_3f8._0_8_);
            }
          }
          else {
            (*(*(_func_int ***)local_3f8._32_8_)[3])();
          }
        }
      }
      piVar13 = (int *)CONCAT44(local_468._12_4_,local_468._8_4_);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if ((Allocator *)local_468._32_8_ == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_468._4_4_,local_468._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(local_468._4_4_,local_468._0_4_));
            }
          }
          else {
            (*(*(_func_int ***)local_468._32_8_)[3])();
          }
        }
      }
      local_428 = 0;
      local_468._0_4_ = 0;
      local_468._4_4_ = 0;
      local_468._8_4_ = 0;
      local_468._12_4_ = 0;
      local_468._16_4_ = 0;
      local_468._20_4_ = 0;
      local_468._24_4_ = 0;
      local_468._32_8_ = (Allocator *)0x0;
      local_468._40_4_ = 0;
      local_468._44_4_ = 0;
      local_468._48_12_ = SUB1612((undefined1  [16])0x0,4);
      local_3b8 = 0;
      local_3f8._0_8_ = (void *)0x0;
      local_3f8._8_4_ = 0;
      local_3f8._12_4_ = 0;
      local_3f8._16_8_ = 0;
      local_3f8._24_4_ = 0;
      local_3f8._32_8_ = (Allocator *)0x0;
      local_3f8._40_4_ = 0;
      local_3f8._44_4_ = 0;
      local_3f8._48_12_ = SUB1612((undefined1  [16])0x0,4);
      local_368 = 0;
      local_3a8._0_4_ = 0;
      local_3a8._4_4_ = 0;
      local_3a8._8_4_ = 0;
      local_3a8._12_4_ = 0;
      local_3a8._16_8_ = 0;
      local_3a8._24_4_ = 0;
      local_3a8._32_8_ = (Allocator *)0x0;
      local_3a8._40_4_ = 0;
      local_3a8._44_4_ = 0;
      local_3a8._48_12_ = SUB1612((undefined1  [16])0x0,4);
      ncnn::Extractor::extract
                ((Extractor *)local_478,"face_rpn_cls_prob_reshape_stride16",(Mat *)local_468,0);
      ncnn::Extractor::extract
                ((Extractor *)local_478,"face_rpn_bbox_pred_stride16",(Mat *)local_3f8,0);
      ncnn::Extractor::extract
                ((Extractor *)local_478,"face_rpn_landmark_pred_stride16",(Mat *)local_3a8,0);
      local_2d8 = 0;
      local_318._0_4_ = 0;
      local_318._4_4_ = 0;
      local_318._8_4_ = 0;
      local_318._12_4_ = 0;
      local_318._16_12_ = SUB1612((undefined1  [16])0x0,4);
      local_2f8 = (Allocator *)0x0;
      iStack_2f0 = 0;
      iStack_2ec = 0;
      auStack_2e8 = SUB1612((undefined1  [16])0x0,4);
      ncnn::Mat::create((Mat *)local_318,1,4,(Allocator *)0x0);
      *(undefined4 *)CONCAT44(local_318._4_4_,local_318._0_4_) = 0x3f800000;
      local_268 = 0;
      local_2a8._0_4_ = 0;
      local_2a8._4_4_ = 0;
      local_2a8._8_4_ = 0;
      local_2a8._12_4_ = 0;
      local_2a8._16_12_ = SUB1612((undefined1  [16])0x0,4);
      local_288 = (Allocator *)0x0;
      iStack_280 = 0;
      iStack_27c = 0;
      auStack_278 = SUB1612((undefined1  [16])0x0,4);
      pMVar21 = (Mat *)0x0;
      ncnn::Mat::create((Mat *)local_2a8,2,4,(Allocator *)0x0);
      *(undefined8 *)CONCAT44(local_2a8._4_4_,local_2a8._0_4_) = 0x4080000041000000;
      generate_anchors(&local_258,(int)local_318,(Mat *)local_2a8,pMVar21);
      local_418.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_418.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_418.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      generate_proposals(&local_258,0x10,(Mat *)local_468,(Mat *)local_3f8,(Mat *)local_3a8,0.0,
                         &local_418);
      std::vector<FaceObject,std::allocator<FaceObject>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<FaceObject*,std::vector<FaceObject,std::allocator<FaceObject>>>>
                ((vector<FaceObject,std::allocator<FaceObject>> *)&local_358,
                 local_358.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 local_418.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                 super__Vector_impl_data._M_start);
      if (local_418.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_418.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_258.refcount != (int *)0x0) {
        LOCK();
        *local_258.refcount = *local_258.refcount + -1;
        UNLOCK();
        if (*local_258.refcount == 0) {
          if (local_258.allocator == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_258.data._4_4_,(int)local_258.data) != (void *)0x0) {
              free((void *)CONCAT44(local_258.data._4_4_,(int)local_258.data));
            }
          }
          else {
            (*(local_258.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar13 = (int *)CONCAT44(local_2a8._12_4_,local_2a8._8_4_);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if (local_288 == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_2a8._4_4_,local_2a8._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(local_2a8._4_4_,local_2a8._0_4_));
            }
          }
          else {
            (*local_288->_vptr_Allocator[3])();
          }
        }
      }
      piVar13 = (int *)CONCAT44(local_318._12_4_,local_318._8_4_);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if (local_2f8 == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_318._4_4_,local_318._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(local_318._4_4_,local_318._0_4_));
            }
          }
          else {
            (*local_2f8->_vptr_Allocator[3])();
          }
        }
      }
      piVar13 = (int *)CONCAT44(local_3a8._12_4_,local_3a8._8_4_);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if ((Allocator *)local_3a8._32_8_ == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_3a8._4_4_,local_3a8._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(local_3a8._4_4_,local_3a8._0_4_));
            }
          }
          else {
            (*(*(_func_int ***)local_3a8._32_8_)[3])();
          }
        }
      }
      piVar13 = (int *)CONCAT44(local_3f8._12_4_,local_3f8._8_4_);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if ((Allocator *)local_3f8._32_8_ == (Allocator *)0x0) {
            if ((void *)local_3f8._0_8_ != (void *)0x0) {
              free((void *)local_3f8._0_8_);
            }
          }
          else {
            (*(*(_func_int ***)local_3f8._32_8_)[3])();
          }
        }
      }
      piVar13 = (int *)CONCAT44(local_468._12_4_,local_468._8_4_);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if ((Allocator *)local_468._32_8_ == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_468._4_4_,local_468._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(local_468._4_4_,local_468._0_4_));
            }
          }
          else {
            (*(*(_func_int ***)local_468._32_8_)[3])();
          }
        }
      }
      local_428 = 0;
      local_468._0_4_ = 0;
      local_468._4_4_ = 0;
      local_468._8_4_ = 0;
      local_468._12_4_ = 0;
      local_468._16_4_ = 0;
      local_468._20_4_ = 0;
      local_468._24_4_ = 0;
      local_468._32_8_ = (Allocator *)0x0;
      local_468._40_4_ = 0;
      local_468._44_4_ = 0;
      local_468._48_12_ = SUB1612((undefined1  [16])0x0,4);
      local_3b8 = 0;
      local_3f8._0_8_ = (void *)0x0;
      local_3f8._8_4_ = 0;
      local_3f8._12_4_ = 0;
      local_3f8._16_8_ = 0;
      local_3f8._24_4_ = 0;
      local_3f8._32_8_ = (Allocator *)0x0;
      local_3f8._40_4_ = 0;
      local_3f8._44_4_ = 0;
      local_3f8._48_12_ = SUB1612((undefined1  [16])0x0,4);
      local_368 = 0;
      local_3a8._0_4_ = 0;
      local_3a8._4_4_ = 0;
      local_3a8._8_4_ = 0;
      local_3a8._12_4_ = 0;
      local_3a8._16_8_ = 0;
      local_3a8._24_4_ = 0;
      local_3a8._32_8_ = (Allocator *)0x0;
      local_3a8._40_4_ = 0;
      local_3a8._44_4_ = 0;
      local_3a8._48_12_ = SUB1612((undefined1  [16])0x0,4);
      ncnn::Extractor::extract
                ((Extractor *)local_478,"face_rpn_cls_prob_reshape_stride8",(Mat *)local_468,0);
      ncnn::Extractor::extract
                ((Extractor *)local_478,"face_rpn_bbox_pred_stride8",(Mat *)local_3f8,0);
      ncnn::Extractor::extract
                ((Extractor *)local_478,"face_rpn_landmark_pred_stride8",(Mat *)local_3a8,0);
      local_2d8 = 0;
      local_318._0_4_ = 0;
      local_318._4_4_ = 0;
      local_318._8_4_ = 0;
      local_318._12_4_ = 0;
      local_318._16_12_ = SUB1612((undefined1  [16])0x0,4);
      local_2f8 = (Allocator *)0x0;
      iStack_2f0 = 0;
      iStack_2ec = 0;
      auStack_2e8 = SUB1612((undefined1  [16])0x0,4);
      ncnn::Mat::create((Mat *)local_318,1,4,(Allocator *)0x0);
      *(undefined4 *)CONCAT44(local_318._4_4_,local_318._0_4_) = 0x3f800000;
      local_268 = 0;
      local_2a8._0_4_ = 0;
      local_2a8._4_4_ = 0;
      local_2a8._8_4_ = 0;
      local_2a8._12_4_ = 0;
      local_2a8._16_12_ = SUB1612((undefined1  [16])0x0,4);
      local_288 = (Allocator *)0x0;
      iStack_280 = 0;
      iStack_27c = 0;
      auStack_278 = SUB1612((undefined1  [16])0x0,4);
      pMVar21 = (Mat *)0x0;
      ncnn::Mat::create((Mat *)local_2a8,2,4,(Allocator *)0x0);
      *(undefined8 *)CONCAT44(local_2a8._4_4_,local_2a8._0_4_) = 0x3f80000040000000;
      generate_anchors(&local_258,(int)local_318,(Mat *)local_2a8,pMVar21);
      local_418.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_418.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_418.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      generate_proposals(&local_258,8,(Mat *)local_468,(Mat *)local_3f8,(Mat *)local_3a8,0.0,
                         &local_418);
      std::vector<FaceObject,std::allocator<FaceObject>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<FaceObject*,std::vector<FaceObject,std::allocator<FaceObject>>>>
                ((vector<FaceObject,std::allocator<FaceObject>> *)&local_358,
                 local_358.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 local_418.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_418.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      if (local_418.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_418.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_258.refcount != (int *)0x0) {
        LOCK();
        *local_258.refcount = *local_258.refcount + -1;
        UNLOCK();
        if (*local_258.refcount == 0) {
          if (local_258.allocator == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_258.data._4_4_,(int)local_258.data) != (void *)0x0) {
              free((void *)CONCAT44(local_258.data._4_4_,(int)local_258.data));
            }
          }
          else {
            (*(local_258.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar13 = (int *)CONCAT44(local_2a8._12_4_,local_2a8._8_4_);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if (local_288 == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_2a8._4_4_,local_2a8._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(local_2a8._4_4_,local_2a8._0_4_));
            }
          }
          else {
            (*local_288->_vptr_Allocator[3])();
          }
        }
      }
      piVar13 = (int *)CONCAT44(local_318._12_4_,local_318._8_4_);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if (local_2f8 == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_318._4_4_,local_318._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(local_318._4_4_,local_318._0_4_));
            }
          }
          else {
            (*local_2f8->_vptr_Allocator[3])();
          }
        }
      }
      piVar13 = (int *)CONCAT44(local_3a8._12_4_,local_3a8._8_4_);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if ((Allocator *)local_3a8._32_8_ == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_3a8._4_4_,local_3a8._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(local_3a8._4_4_,local_3a8._0_4_));
            }
          }
          else {
            (*(*(_func_int ***)local_3a8._32_8_)[3])();
          }
        }
      }
      piVar13 = (int *)CONCAT44(local_3f8._12_4_,local_3f8._8_4_);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if ((Allocator *)local_3f8._32_8_ == (Allocator *)0x0) {
            if ((void *)local_3f8._0_8_ != (void *)0x0) {
              free((void *)local_3f8._0_8_);
            }
          }
          else {
            (*(*(_func_int ***)local_3f8._32_8_)[3])();
          }
        }
      }
      piVar13 = (int *)CONCAT44(local_468._12_4_,local_468._8_4_);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if ((Allocator *)local_468._32_8_ == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_468._4_4_,local_468._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(local_468._4_4_,local_468._0_4_));
            }
          }
          else {
            (*(*(_func_int ***)local_468._32_8_)[3])();
          }
        }
      }
      pFVar24 = local_358.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (local_358.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_358.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        qsort_descent_inplace
                  (&local_358,0,
                   (int)((ulong)((long)local_358.
                                       super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                (long)local_358.
                                      super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                                      _M_impl.super__Vector_impl_data._M_start) >> 2) * -0x11111111
                   + -1);
        pFVar24 = local_358.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      local_3f8._0_8_ = (void *)0x0;
      local_3f8._8_4_ = 0;
      local_3f8._12_4_ = 0;
      local_3f8._16_8_ = (int *)0x0;
      uVar27 = (int)((long)pFVar24 -
                     (long)local_358.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                           _M_impl.super__Vector_impl_data._M_start >> 2) * -0x11111111;
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)local_468,(long)(int)uVar27,
                 (allocator_type *)local_3a8);
      if (0 < (int)uVar27) {
        pfVar19 = &((local_358.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                     super__Vector_impl_data._M_start)->rect).height;
        uVar23 = 0;
        do {
          *(float *)(CONCAT44(local_468._4_4_,local_468._0_4_) + uVar23 * 4) =
               pfVar19[-1] * *pfVar19;
          uVar23 = uVar23 + 1;
          pfVar19 = pfVar19 + 0xf;
        } while ((uVar27 & 0x7fffffff) != uVar23);
        local_3a8._0_4_ = 0;
        do {
          uVar22 = (uint)((ulong)(local_3f8._8_8_ - local_3f8._0_8_) >> 2);
          if ((int)uVar22 < 1) {
LAB_00127a8b:
            if (local_3f8._8_8_ == local_3f8._16_8_) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)local_3f8,(iterator)local_3f8._8_8_,
                         (int *)local_3a8);
            }
            else {
              *(undefined4 *)local_3f8._8_8_ = local_3a8._0_4_;
              local_3f8._8_8_ = local_3f8._8_8_ + 4;
            }
          }
          else {
            lVar25 = (long)(int)local_3a8._0_4_;
            uVar23._0_4_ = local_358.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                           _M_impl.super__Vector_impl_data._M_start[lVar25].rect.x;
            uVar23._4_4_ = local_358.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                           _M_impl.super__Vector_impl_data._M_start[lVar25].rect.y;
            auVar36._8_8_ = 0;
            auVar36._0_8_ = uVar23;
            uVar3 = local_358.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar25].rect.width;
            uVar8 = local_358.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar25].rect.height;
            auVar31._0_4_ = (float)uVar3 + (float)(undefined4)uVar23;
            auVar31._4_4_ = (float)uVar8 + (float)uVar23._4_4_;
            auVar31._8_8_ = 0;
            bVar14 = true;
            uVar23 = 0;
            do {
              lVar26 = (long)*(int *)(local_3f8._0_8_ + uVar23 * 4);
              uVar6._0_4_ = local_358.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                            _M_impl.super__Vector_impl_data._M_start[lVar26].rect.x;
              uVar6._4_4_ = local_358.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                            _M_impl.super__Vector_impl_data._M_start[lVar26].rect.y;
              auVar39._8_8_ = 0;
              auVar39._0_8_ = uVar6;
              uVar4 = local_358.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar26].rect.width;
              uVar9 = local_358.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar26].rect.height;
              auVar34._0_4_ = (float)uVar4 + (float)(undefined4)uVar6;
              auVar34._4_4_ = (float)uVar9 + (float)uVar6._4_4_;
              auVar34._8_8_ = 0;
              auVar39 = maxps(auVar39,auVar36);
              auVar34 = minps(auVar34,auVar31);
              fVar32 = auVar34._0_4_ - auVar39._0_4_;
              fVar38 = auVar34._4_4_ - auVar39._4_4_;
              fVar33 = 0.0;
              if (0.0 < fVar38 && 0.0 < fVar32) {
                fVar33 = fVar32 * fVar38;
              }
              if (0.4 < fVar33 / ((*(float *)(CONCAT44(local_468._4_4_,local_468._0_4_) + lVar26 * 4
                                             ) +
                                  *(float *)(CONCAT44(local_468._4_4_,local_468._0_4_) + lVar25 * 4)
                                  ) - fVar33)) {
                bVar14 = false;
              }
              uVar23 = uVar23 + 1;
            } while ((uVar22 & 0x7fffffff) != uVar23);
            if (bVar14) goto LAB_00127a8b;
          }
          local_3a8._0_4_ = local_3a8._0_4_ + 1;
        } while ((int)local_3a8._0_4_ < (int)uVar27);
      }
      if ((void *)CONCAT44(local_468._4_4_,local_468._0_4_) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_468._4_4_,local_468._0_4_));
      }
      uVar27 = (uint)((ulong)(local_3f8._8_8_ - local_3f8._0_8_) >> 2);
      std::vector<FaceObject,_std::allocator<FaceObject>_>::resize
                ((vector<FaceObject,_std::allocator<FaceObject>_> *)local_2c8,(long)(int)uVar27);
      if (0 < (int)uVar27) {
        uVar28 = CONCAT44((float)(int)local_338 + -1.0,(float)local_338._4_4_ + -1.0);
        uVar23 = 0;
        pFVar24 = (pointer)local_2c8._0_8_;
        do {
          iVar17 = *(int *)(local_3f8._0_8_ + uVar23 * 4);
          pFVar1 = (pointer)(local_2c8._0_8_ + uVar23 * 0x3c);
          uVar7._0_4_ = local_358.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                        _M_impl.super__Vector_impl_data._M_start[iVar17].rect.x;
          uVar7._4_4_ = local_358.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                        _M_impl.super__Vector_impl_data._M_start[iVar17].rect.y;
          auVar30._8_8_ = 0;
          auVar30._0_8_ = uVar7;
          (((pointer)(local_2c8._0_8_ + uVar23 * 0x3c))->rect).x = (float)(undefined4)uVar7;
          (((pointer)(local_2c8._0_8_ + uVar23 * 0x3c))->rect).y = (float)uVar7._4_4_;
          uVar5 = local_358.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar17].rect.width;
          uVar10 = local_358.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar17].rect.height;
          (((pointer)(local_2c8._0_8_ + uVar23 * 0x3c))->rect).width = (float)uVar5;
          (((pointer)(local_2c8._0_8_ + uVar23 * 0x3c))->rect).height = (float)uVar10;
          lVar25 = 2;
          do {
            pFVar24->landmark[lVar25 + -2] =
                 local_358.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar17].landmark[lVar25 + -2];
            lVar25 = lVar25 + 1;
          } while (lVar25 != 7);
          pFVar1->prob = local_358.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                         _M_impl.super__Vector_impl_data._M_start[iVar17].prob;
          auVar35._8_4_ = (float)(int)auStack_330._0_4_ + 0.0;
          auVar35._0_8_ = uVar28;
          auVar35._12_4_ = (float)(int)auStack_330._4_4_ + 0.0;
          auVar36 = minps(auVar35,auVar30);
          auVar29._0_4_ = (float)uVar5 + (float)(undefined4)uVar7;
          auVar29._4_4_ = (float)uVar10 + (float)uVar7._4_4_;
          auVar29._8_8_ = 0;
          auVar31 = maxps(ZEXT816(0),auVar36);
          auVar37._8_4_ = (float)(int)auStack_330._0_4_ + 0.0;
          auVar37._0_8_ = uVar28;
          auVar37._12_4_ = (float)(int)auStack_330._4_4_ + 0.0;
          auVar36 = minps(auVar37,auVar29);
          auVar36 = maxps(ZEXT816(0),auVar36);
          (pFVar1->rect).x = (float)(int)auVar31._0_8_;
          (pFVar1->rect).y = (float)(int)((ulong)auVar31._0_8_ >> 0x20);
          (pFVar1->rect).width = auVar36._0_4_ - auVar31._0_4_;
          (pFVar1->rect).height = auVar36._4_4_ - auVar31._4_4_;
          uVar23 = uVar23 + 1;
          pFVar24 = pFVar24 + 1;
        } while (uVar23 != (uVar27 & 0x7fffffff));
      }
      if ((void *)local_3f8._0_8_ != (void *)0x0) {
        operator_delete((void *)local_3f8._0_8_);
      }
      if (local_358.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_358.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      ncnn::Extractor::~Extractor((Extractor *)local_478);
      piVar13 = (int *)CONCAT44(local_1f8.refcount._4_4_,local_1f8.refcount._0_4_);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if (local_1f8.allocator == (Allocator *)0x0) {
            if (local_1f8.data != (void *)0x0) {
              free(local_1f8.data);
            }
          }
          else {
            (*(local_1f8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      ncnn::Net::~Net(local_198);
      cv::Mat::clone();
      pAVar15 = (Allocator *)CONCAT44(local_468._4_4_,local_468._0_4_);
      if (local_2c8._8_8_ != local_2c8._0_8_) {
        local_338 = (Allocator **)0x0;
        auStack_330[0] = false;
        auStack_330[1] = false;
        auStack_330[2] = false;
        auStack_330[3] = false;
        auStack_330._4_4_ = 0x406fe000;
        lVar25 = 0;
        uVar23 = 0;
        pFVar24 = (pointer)local_2c8._0_8_;
        do {
          local_200 = uVar23;
          local_468._0_8_ = pAVar15;
          fprintf(_stderr,"%.5f at %.2f %.2f %.2f x %.2f\n",
                  (double)*(float *)((long)(pFVar24->landmark + 5) + lVar25),
                  (double)*(float *)((long)&(((FaceObject *)(pFVar24->landmark + -2))->rect).x +
                                    lVar25),
                  (double)*(float *)((long)pFVar24->landmark + lVar25 + -0xc),
                  (double)*(float *)((long)(pFVar24->landmark + -1) + lVar25),
                  (double)*(float *)((long)pFVar24->landmark + lVar25 + -4));
          local_468._16_4_ = 0;
          local_468._20_4_ = 0;
          local_468._0_4_ = 0x3010000;
          pfVar19 = (float *)((long)&(((FaceObject *)(pFVar24->landmark + -2))->rect).x + lVar25);
          local_318._0_4_ = (undefined4)ROUND(*pfVar19);
          local_318._4_4_ = (undefined4)ROUND(pfVar19[1]);
          local_318._8_4_ = (undefined4)ROUND(pfVar19[2]);
          local_318._12_4_ = (undefined4)ROUND(pfVar19[3]);
          local_198[0]._vptr_Net = (_func_int **)local_338;
          local_198[0].opt.lightmode = (bool)auStack_330[0];
          local_198[0].opt.use_shader_pack8 = (bool)auStack_330[1];
          local_198[0].opt.use_subgroup_ops = (bool)auStack_330[2];
          local_198[0].opt.use_reserved_0 = (bool)auStack_330[3];
          local_198[0].opt.num_threads = auStack_330._4_4_;
          local_198[0].opt.blob_allocator = (Allocator *)0x0;
          local_198[0].opt.workspace_allocator = (Allocator *)0x0;
          local_468._8_8_ = &local_1f8;
          cv::rectangle((string *)local_468,local_318,local_198,1,8,0);
          local_468._16_4_ = 0;
          local_468._20_4_ = 0;
          local_468._0_4_ = 0x3010000;
          local_258.data._0_4_ = (int)ROUND(*(float *)((long)&pFVar24->landmark[0].x + lVar25));
          local_258.data._4_4_ = (int)ROUND(*(float *)((long)&pFVar24->landmark[0].y + lVar25));
          local_198[0]._vptr_Net = (_func_int **)local_338;
          local_198[0].opt.lightmode = (bool)auStack_330[0];
          local_198[0].opt.use_shader_pack8 = (bool)auStack_330[1];
          local_198[0].opt.use_subgroup_ops = (bool)auStack_330[2];
          local_198[0].opt.use_reserved_0 = (bool)auStack_330[3];
          local_198[0].opt.num_threads = auStack_330._4_4_;
          local_198[0].opt.blob_allocator = (Allocator *)0x406fe00000000000;
          local_198[0].opt.workspace_allocator = (Allocator *)0x0;
          local_468._8_8_ = &local_1f8;
          cv::circle((string *)local_468,&local_258,2,local_198,0xffffffff,8,0);
          local_468._16_4_ = 0;
          local_468._20_4_ = 0;
          local_468._0_4_ = 0x3010000;
          local_358.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
          super__Vector_impl_data._M_start._4_4_ =
               (int)ROUND(*(float *)((long)&pFVar24->landmark[1].y + lVar25));
          local_358.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ =
               (int)ROUND(*(float *)((long)&pFVar24->landmark[1].x + lVar25));
          local_198[0]._vptr_Net = (_func_int **)local_338;
          local_198[0].opt.lightmode = (bool)auStack_330[0];
          local_198[0].opt.use_shader_pack8 = (bool)auStack_330[1];
          local_198[0].opt.use_subgroup_ops = (bool)auStack_330[2];
          local_198[0].opt.use_reserved_0 = (bool)auStack_330[3];
          local_198[0].opt.num_threads = auStack_330._4_4_;
          local_198[0].opt.blob_allocator = (Allocator *)0x406fe00000000000;
          local_198[0].opt.workspace_allocator = (Allocator *)0x0;
          local_468._8_8_ = &local_1f8;
          cv::circle((string *)local_468,&local_358,2,local_198,0xffffffff,8,0);
          local_468._16_4_ = 0;
          local_468._20_4_ = 0;
          local_468._0_4_ = 0x3010000;
          local_418.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
          super__Vector_impl_data._M_start._4_4_ =
               (int)ROUND(*(float *)((long)&pFVar24->landmark[2].y + lVar25));
          local_418.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ =
               (int)ROUND(*(float *)((long)&pFVar24->landmark[2].x + lVar25));
          local_198[0]._vptr_Net = (_func_int **)local_338;
          local_198[0].opt.lightmode = (bool)auStack_330[0];
          local_198[0].opt.use_shader_pack8 = (bool)auStack_330[1];
          local_198[0].opt.use_subgroup_ops = (bool)auStack_330[2];
          local_198[0].opt.use_reserved_0 = (bool)auStack_330[3];
          local_198[0].opt.num_threads = auStack_330._4_4_;
          local_198[0].opt.blob_allocator = (Allocator *)0x406fe00000000000;
          local_198[0].opt.workspace_allocator = (Allocator *)0x0;
          local_468._8_8_ = &local_1f8;
          cv::circle((string *)local_468,&local_418,2,local_198,0xffffffff,8,0);
          local_468._16_4_ = 0;
          local_468._20_4_ = 0;
          local_468._0_4_ = 0x3010000;
          local_478._0_4_ = (undefined4)ROUND(*(float *)((long)&pFVar24->landmark[3].x + lVar25));
          local_478._4_4_ = (undefined4)ROUND(*(float *)((long)&pFVar24->landmark[3].y + lVar25));
          local_198[0]._vptr_Net = (_func_int **)local_338;
          local_198[0].opt.lightmode = (bool)auStack_330[0];
          local_198[0].opt.use_shader_pack8 = (bool)auStack_330[1];
          local_198[0].opt.use_subgroup_ops = (bool)auStack_330[2];
          local_198[0].opt.use_reserved_0 = (bool)auStack_330[3];
          local_198[0].opt.num_threads = auStack_330._4_4_;
          local_198[0].opt.blob_allocator = (Allocator *)0x406fe00000000000;
          local_198[0].opt.workspace_allocator = (Allocator *)0x0;
          local_468._8_8_ = &local_1f8;
          cv::circle((string *)local_468,local_478,2,local_198,0xffffffff,8,0);
          local_468._16_4_ = 0;
          local_468._20_4_ = 0;
          local_468._0_4_ = 0x3010000;
          local_208 = (int)ROUND(*(float *)((long)&pFVar24->landmark[4].x + lVar25));
          local_204 = (int)ROUND(*(float *)((long)&pFVar24->landmark[4].y + lVar25));
          local_198[0]._vptr_Net = (_func_int **)local_338;
          local_198[0].opt.lightmode = (bool)auStack_330[0];
          local_198[0].opt.use_shader_pack8 = (bool)auStack_330[1];
          local_198[0].opt.use_subgroup_ops = (bool)auStack_330[2];
          local_198[0].opt.use_reserved_0 = (bool)auStack_330[3];
          local_198[0].opt.num_threads = auStack_330._4_4_;
          local_198[0].opt.blob_allocator = (Allocator *)0x406fe00000000000;
          local_198[0].opt.workspace_allocator = (Allocator *)0x0;
          local_468._8_8_ = &local_1f8;
          cv::circle((string *)local_468,&local_208,2,local_198,0xffffffff,8,0);
          sprintf((char *)local_198,"%.1f%%",
                  (double)(*(float *)((long)(pFVar24->landmark + 5) + lVar25) * 100.0));
          local_3fc = 0;
          local_468._0_8_ = (Allocator *)(local_468 + 0x10);
          sVar20 = strlen((char *)local_198);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_468,local_198,(long)&local_198[0]._vptr_Net + sVar20);
          cv::getTextSize((string *)&local_320,(int)(string *)local_468,0.5,0,(int *)0x1);
          if ((Allocator *)local_468._0_8_ != (Allocator *)(local_468 + 0x10)) {
            operator_delete((void *)local_468._0_8_);
          }
          iVar18 = (int)*(float *)((long)&(((FaceObject *)(pFVar24->landmark + -2))->rect).x +
                                  lVar25);
          iVar17 = (int)((*(float *)((long)pFVar24->landmark + lVar25 + -0xc) - (float)local_31c) -
                        (float)local_3fc);
          if (iVar17 < 1) {
            iVar17 = 0;
          }
          iVar12 = local_1f8.refcount._4_4_ - local_320;
          if (local_320 + iVar18 <= local_1f8.refcount._4_4_) {
            iVar12 = iVar18;
          }
          local_3a8._16_8_ = 0;
          local_3a8._0_4_ = 0x3010000;
          local_2a8._12_4_ = local_3fc + local_31c;
          local_2a8._8_4_ = local_320;
          local_468._0_4_ = 0;
          local_468._4_4_ = 0x406fe000;
          local_468._8_4_ = 0;
          local_468._12_4_ = 0x406fe000;
          local_468._16_4_ = 0;
          local_468._20_4_ = 0x406fe000;
          local_468._24_4_ = 0;
          local_468._28_4_ = 0;
          local_2a8._0_4_ = iVar12;
          local_2a8._4_4_ = iVar17;
          local_3a8._8_8_ = &local_1f8;
          cv::rectangle(local_3a8,local_2a8,(string *)local_468,0xffffffff,8,0);
          local_3a8._16_8_ = 0;
          local_3a8._0_4_ = 0x3010000;
          local_468._0_8_ = (Allocator *)(local_468 + 0x10);
          local_3a8._8_8_ = &local_1f8;
          sVar20 = strlen((char *)local_198);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_468,local_198,(long)&local_198[0]._vptr_Net + sVar20);
          local_20c = iVar17 + local_31c;
          local_3f8._0_8_ = (void *)0x0;
          local_3f8._8_4_ = 0;
          local_3f8._12_4_ = 0;
          local_3f8._16_8_ = (int *)0x0;
          local_3f8._24_4_ = 0;
          local_3f8._28_4_ = 0;
          local_210 = iVar12;
          cv::putText(0x3fe0000000000000,local_3a8,(string *)local_468,&local_210,0,local_3f8,1,8,0)
          ;
          uVar23 = local_200;
          pAVar15 = (Allocator *)local_468._0_8_;
          if ((Allocator *)local_468._0_8_ != (Allocator *)(local_468 + 0x10)) {
            operator_delete((void *)local_468._0_8_);
            pAVar15 = (Allocator *)local_468._0_8_;
          }
          local_468._4_4_ = (undefined4)((ulong)pAVar15 >> 0x20);
          uVar23 = uVar23 + 1;
          lVar25 = lVar25 + 0x3c;
          pFVar24 = (pointer)local_2c8._0_8_;
        } while (uVar23 < (ulong)(((long)(local_2c8._8_8_ - local_2c8._0_8_) >> 2) *
                                 -0x1111111111111111));
      }
      local_468._8_8_ = &local_1f8;
      ppAVar2 = &local_198[0].opt.blob_allocator;
      local_198[0].opt.blob_allocator =
           (Allocator *)CONCAT26(local_198[0].opt.blob_allocator._6_2_,0x6567616d69);
      local_198[0].opt.lightmode = true;
      local_198[0].opt.use_shader_pack8 = false;
      local_198[0].opt.use_subgroup_ops = false;
      local_198[0].opt.use_reserved_0 = false;
      local_198[0].opt.num_threads = 0;
      local_468._16_4_ = 0;
      local_468._20_4_ = 0;
      local_468._0_4_ = 0x1010000;
      local_198[0]._vptr_Net = (_func_int **)ppAVar2;
      cv::imshow((string *)local_198,(_InputArray *)local_468);
      if ((Allocator **)local_198[0]._vptr_Net != ppAVar2) {
        operator_delete(local_198[0]._vptr_Net);
      }
      cv::waitKey(0);
      cv::Mat::~Mat((Mat *)&local_1f8);
      if ((pointer)local_2c8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_2c8._0_8_);
      }
      iVar17 = 0;
    }
    else {
      fprintf(_stderr,"cv::imread %s failed\n",pcVar11);
      iVar17 = -1;
    }
    cv::Mat::~Mat((Mat *)local_90);
  }
  else {
    main_cold_1();
    iVar17 = -1;
  }
  return iVar17;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        fprintf(stderr, "Usage: %s [imagepath]\n", argv[0]);
        return -1;
    }

    const char* imagepath = argv[1];

    cv::Mat m = cv::imread(imagepath, 1);
    if (m.empty())
    {
        fprintf(stderr, "cv::imread %s failed\n", imagepath);
        return -1;
    }

    std::vector<FaceObject> faceobjects;
    detect_retinaface(m, faceobjects);

    draw_faceobjects(m, faceobjects);

    return 0;
}